

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarray.c
# Opt level: O3

void tommy_array_init(tommy_array *array)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void **ppvVar4;
  long lVar5;
  long in_FS_OFFSET;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  array->bucket_bit = 6;
  array->bucket_max = 0x40;
  ppvVar4 = (void **)lrtr_calloc(0x40,8);
  array->bucket[0] = ppvVar4;
  auVar3 = _DAT_00117c70;
  auVar2 = _DAT_00117c60;
  lVar5 = 0;
  iVar6 = (int)DAT_00117c80;
  iVar7 = DAT_00117c80._4_4_;
  do {
    auVar8._8_4_ = (int)lVar5;
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8 = (auVar8 | auVar2) ^ auVar3;
    if (auVar8._4_4_ == iVar7 && auVar8._0_4_ < iVar6) {
      array->bucket[lVar5 + 1] = ppvVar4;
      array->bucket[lVar5 + 2] = ppvVar4;
    }
    lVar5 = lVar5 + 2;
  } while (lVar5 != 6);
  array->count = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_array_init(tommy_array* array)
{
	tommy_uint_t i;

	/* fixed initial size */
	array->bucket_bit = TOMMY_ARRAY_BIT;
	array->bucket_max = 1 << array->bucket_bit;
	array->bucket[0] = tommy_cast(void**, tommy_calloc(array->bucket_max, sizeof(void*)));
	for (i = 1; i < TOMMY_ARRAY_BIT; ++i)
		array->bucket[i] = array->bucket[0];

	array->count = 0;
}